

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O0

void __thiscall irr::CIrrDeviceStub::~CIrrDeviceStub(CIrrDeviceStub *this)

{
  ~CIrrDeviceStub((CIrrDeviceStub *)
                  ((long)&(this->super_IrrlichtDevice)._vptr_IrrlichtDevice +
                  (long)(this->super_IrrlichtDevice)._vptr_IrrlichtDevice[-3]));
  return;
}

Assistant:

CIrrDeviceStub::~CIrrDeviceStub()
{
	if (GUIEnvironment)
		GUIEnvironment->drop();

	if (SceneManager)
		SceneManager->drop();

	if (VideoDriver)
		VideoDriver->drop();

	if (ContextManager)
		ContextManager->drop();

	if (FileSystem)
		FileSystem->drop();

	if (InputReceivingSceneManager)
		InputReceivingSceneManager->drop();

	if (CursorControl)
		CursorControl->drop();

	if (Operator)
		Operator->drop();

	CursorControl = 0;

	if (Timer)
		Timer->drop();

	if (Logger->drop())
		os::Printer::Logger = 0;
}